

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O2

bool operator<(BigNumber *b1,BigNumber *b2)

{
  __type _Var1;
  bool bVar2;
  BigNumber BStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)b1);
  _Var1 = std::operator==(&local_38,&b2->_numberString);
  if (_Var1) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string((string *)&BStack_58,(string *)b1);
    bVar2 = operator>(&BStack_58,b2);
    bVar2 = !bVar2;
    std::__cxx11::string::~string((string *)&BStack_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool operator<(BigNumber b1, const BigNumber &b2) {
    return !(b1 == b2) && !(b1 > b2);
}